

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall
dxil_spv::Converter::Impl::decorate_relaxed_precision
          (Impl *this,Type *type,Id id,bool known_integer_sign)

{
  bool bVar1;
  Builder *this_00;
  bool known_integer_sign_local;
  Id id_local;
  Type *type_local;
  Impl *this_local;
  
  bVar1 = type_can_relax_precision(this,type,known_integer_sign);
  if (bVar1) {
    this_00 = builder(this);
    spv::Builder::addDecoration(this_00,id,DecorationRelaxedPrecision,-1);
  }
  return;
}

Assistant:

void Converter::Impl::decorate_relaxed_precision(const llvm::Type *type, spv::Id id, bool known_integer_sign)
{
	// Ignore RelaxedPrecision for integers since they are untyped in LLVM for the most part.
	// For texture loading operations and similar, we load in the appropriate sign, so it's safe to use RelaxedPrecision,
	// since RelaxedPrecision may sign-extend based on the OpTypeInt's signage.
	// DXIL is kinda broken in this regard since min16int and min16uint lower to the same i16 type ... :(
	if (type_can_relax_precision(type, known_integer_sign))
		builder().addDecoration(id, spv::DecorationRelaxedPrecision);
}